

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utIOStreamBuffer.cpp
# Opt level: O0

void __thiscall
IOStreamBufferTest_accessCacheSizeTest_Test::TestBody
          (IOStreamBufferTest_accessCacheSizeTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_120;
  Message local_118;
  size_t local_110;
  uint local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_1;
  IOStreamBuffer<char> myBuffer2;
  Message local_98 [3];
  size_t local_80;
  uint local_74;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  IOStreamBuffer<char> myBuffer1;
  IOStreamBufferTest_accessCacheSizeTest_Test *this_local;
  
  Assimp::IOStreamBuffer<char>::IOStreamBuffer((IOStreamBuffer<char> *)&gtest_ar.message_,0x1000000)
  ;
  local_74 = 0;
  local_80 = Assimp::IOStreamBuffer<char>::cacheSize((IOStreamBuffer<char> *)&gtest_ar.message_);
  testing::internal::CmpHelperNE<unsigned_int,unsigned_long>
            ((internal *)local_70,"0U","myBuffer1.cacheSize()",&local_74,&local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&myBuffer2.m_filePos,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOStreamBuffer.cpp"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&myBuffer2.m_filePos,local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&myBuffer2.m_filePos);
    testing::Message::~Message(local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  Assimp::IOStreamBuffer<char>::IOStreamBuffer((IOStreamBuffer<char> *)&gtest_ar_1.message_,100);
  local_104 = 100;
  local_110 = Assimp::IOStreamBuffer<char>::cacheSize((IOStreamBuffer<char> *)&gtest_ar_1.message_);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((EqHelper<false> *)local_100,"100U","myBuffer2.cacheSize()",&local_104,&local_110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOStreamBuffer.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  Assimp::IOStreamBuffer<char>::~IOStreamBuffer((IOStreamBuffer<char> *)&gtest_ar_1.message_);
  Assimp::IOStreamBuffer<char>::~IOStreamBuffer((IOStreamBuffer<char> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST_F( IOStreamBufferTest, accessCacheSizeTest ) {
    IOStreamBuffer<char> myBuffer1;
    EXPECT_NE( 0U, myBuffer1.cacheSize() );

    IOStreamBuffer<char> myBuffer2( 100 );
    EXPECT_EQ( 100U, myBuffer2.cacheSize() );
}